

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileLibraryTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileLibraryTargetGenerator::WriteFrameworkRules
          (cmMakefileLibraryTargetGenerator *this,bool relink)

{
  cmGeneratorTarget *this_00;
  cmLocalUnixMakefileGenerator3 *this_01;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  string extraFlags;
  string linkRuleVar;
  string local_58;
  undefined1 local_38 [8];
  string linkLanguage;
  bool relink_local;
  cmMakefileLibraryTargetGenerator *this_local;
  
  this_00 = (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
  linkLanguage.field_2._M_local_buf[0xf] = relink;
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_58,&this->super_cmMakefileTargetGenerator);
  cmGeneratorTarget::GetLinkerLanguage((string *)local_38,this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  cmStrCat<char_const(&)[7],std::__cxx11::string&,char_const(&)[25]>
            ((string *)((long)&extraFlags.field_2 + 8),(char (*) [7])0xfecd37,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
             (char (*) [25])"_CREATE_MACOSX_FRAMEWORK");
  std::__cxx11::string::string((string *)local_a8);
  cmMakefileTargetGenerator::GetTargetLinkFlags
            (&this->super_cmMakefileTargetGenerator,(string *)local_a8,(string *)local_38);
  this_01 = (this->super_cmMakefileTargetGenerator).LocalGenerator;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS",&local_c9);
  cmMakefileTargetGenerator::GetConfigName_abi_cxx11_
            (&local_f0,&this->super_cmMakefileTargetGenerator);
  cmLocalGenerator::AddConfigVariableFlags
            ((cmLocalGenerator *)this_01,(string *)local_a8,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  WriteLibraryRules(this,(string *)((long)&extraFlags.field_2 + 8),(string *)local_a8,
                    (bool)(linkLanguage.field_2._M_local_buf[0xf] & 1));
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)(extraFlags.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmMakefileLibraryTargetGenerator::WriteFrameworkRules(bool relink)
{
  std::string linkLanguage =
    this->GeneratorTarget->GetLinkerLanguage(this->GetConfigName());
  std::string linkRuleVar =
    cmStrCat("CMAKE_", linkLanguage, "_CREATE_MACOSX_FRAMEWORK");

  std::string extraFlags;
  this->GetTargetLinkFlags(extraFlags, linkLanguage);
  this->LocalGenerator->AddConfigVariableFlags(
    extraFlags, "CMAKE_MACOSX_FRAMEWORK_LINKER_FLAGS", this->GetConfigName());

  this->WriteLibraryRules(linkRuleVar, extraFlags, relink);
}